

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O2

bool __thiscall DTreeParenthoodPropagator::propagateRemEdge(DTreeParenthoodPropagator *this,int e)

{
  int *piVar1;
  uint *puVar2;
  IntVar *pIVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int o;
  Clause *pCVar7;
  uint uVar8;
  vec<Lit> local_48;
  Lit local_2c;
  
  bVar4 = DReachabilityPropagator::propagateRemEdge((DReachabilityPropagator *)this,e);
  if (bVar4) {
    piVar1 = (this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
             endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[e].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    bVar5 = IntVar::indomain((this->parents).data[(uint)piVar1[1]],(long)*piVar1);
    if (bVar5) {
      puVar2 = *(uint **)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                          super_GraphPropagator.endnodes.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[e].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
      uVar6 = *puVar2;
      uVar8 = puVar2[1];
      if (uVar8 != uVar6) {
        if (so.lazy == true) {
          local_48.sz = 0;
          local_48.cap = 0;
          local_48.data = (Lit *)0x0;
          vec<Lit>::push(&local_48);
          local_2c = BoolView::getValLit((this->super_DTreePropagator).super_DReachabilityPropagator
                                         .super_GraphPropagator.es.data + (uint)e);
          vec<Lit>::push(&local_48,&local_2c);
          pCVar7 = Reason_new<vec<Lit>>(&local_48);
          free(local_48.data);
          puVar2 = *(uint **)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                              super_GraphPropagator.endnodes.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[e].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data;
          uVar6 = *puVar2;
          uVar8 = puVar2[1];
        }
        else {
          pCVar7 = (Clause *)0x0;
        }
        pIVar3 = (this->parents).data[uVar8];
        (*(pIVar3->super_Var).super_Branching._vptr_Branching[0x11])
                  (pIVar3,(long)(int)uVar6,pCVar7,1);
        o = IntVar::size((this->parents).data
                         [*(uint *)(*(long *)&(this->super_DTreePropagator).
                                              super_DReachabilityPropagator.super_GraphPropagator.
                                              endnodes.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[e].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 4)]);
        Tint::operator=(this->dom_size +
                        *(int *)(*(long *)&(this->super_DTreePropagator).
                                           super_DReachabilityPropagator.super_GraphPropagator.
                                           endnodes.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[e].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data + 4),o);
      }
    }
  }
  return bVar4;
}

Assistant:

bool DTreeParenthoodPropagator::propagateRemEdge(int e) {
	assert(getEdgeVar(e).isFixed());
	assert(getEdgeVar(e).isFalse());

	if (!DTreePropagator::propagateRemEdge(e)) {
		return false;
	}

	// If tail of e is the only possible parent of head of e
	// fail (unless head of e is the root)
	// Otherwise remove that value and that's it.
	if (parents[getHead(e)]->indomain(getTail(e))) {
		if (getHead(e) == getTail(e)) {
			return true;
		}
		Clause* r = nullptr;
		if (so.lazy) {
			vec<Lit> ps;
			ps.push();
			ps.push(getEdgeVar(e).getValLit());
			r = Reason_new(ps);
		}
		parents[getHead(e)]->remVal(getTail(e), r);
		if (DEBUG) {
			std::cout << "This guy " << getHead(e) << " cannot have " << getTail(e)
								<< " as a parent, because I removed edge" << e << '\n';
		}
		assert(parents[getHead(e)]->size() > 0);
		dom_size[getHead(e)] = parents[getHead(e)]->size();
	}

	return true;
}